

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

void compute_flow_matrix(int16_t *dx,int dx_stride,int16_t *dy,int dy_stride,double *M)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 *in_R8;
  __m128i result;
  __m256i result_256;
  __m256i partial_sum_1;
  __m256i partial_sum_0;
  __m256i dy_row;
  __m256i dx_row;
  int i;
  __m256i acc [4];
  int local_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_380 [32];
  undefined8 *local_358;
  int local_34c;
  long local_348;
  int local_33c;
  long local_338;
  undefined1 local_c0 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_358 = in_R8;
  local_34c = in_ECX;
  local_348 = in_RDX;
  local_33c = in_ESI;
  local_338 = in_RDI;
  memset(local_3e0,0,0x80);
  for (local_3e4 = 0; local_3e4 < 8; local_3e4 = local_3e4 + 2) {
    pauVar5 = (undefined1 (*) [32])(local_338 + (long)(local_3e4 * local_33c) * 2);
    pauVar6 = (undefined1 (*) [32])(local_348 + (long)(local_3e4 * local_34c) * 2);
    auVar4 = vpmaddwd_avx2(*pauVar5,*pauVar5);
    local_3e0 = vpaddd_avx2(local_3e0,auVar4);
    auVar4 = vpmaddwd_avx2(*pauVar5,*pauVar6);
    local_3c0 = vpaddd_avx2(local_3c0,auVar4);
    auVar4 = vpmaddwd_avx2(*pauVar6,*pauVar6);
    local_380 = vpaddd_avx2(local_380,auVar4);
  }
  auVar4 = vphaddd_avx2(local_3e0,local_3c0);
  auVar3 = vphaddd_avx2(local_3c0,local_380);
  auVar4 = vphaddd_avx2(auVar4,auVar3);
  auVar1 = vpaddd_avx(auVar4._16_16_,local_c0);
  auVar2 = vpinsrd_avx(ZEXT416(1),0,1);
  auVar2 = vpinsrd_avx(auVar2,0,2);
  auVar2 = vpinsrd_avx(auVar2,1,3);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  auVar4 = vcvtdq2pd_avx(auVar1);
  local_80 = auVar4._0_8_;
  uStack_78 = auVar4._8_8_;
  uStack_70 = auVar4._16_8_;
  uStack_68 = auVar4._24_8_;
  *local_358 = local_80;
  local_358[1] = uStack_78;
  local_358[2] = uStack_70;
  local_358[3] = uStack_68;
  return;
}

Assistant:

static inline void compute_flow_matrix(const int16_t *dx, int dx_stride,
                                       const int16_t *dy, int dy_stride,
                                       double *M) {
  int tmp[4] = { 0 };

  for (int i = 0; i < DISFLOW_PATCH_SIZE; i++) {
    for (int j = 0; j < DISFLOW_PATCH_SIZE; j++) {
      tmp[0] += dx[i * dx_stride + j] * dx[i * dx_stride + j];
      tmp[1] += dx[i * dx_stride + j] * dy[i * dy_stride + j];
      // Don't compute tmp[2], as it should be equal to tmp[1]
      tmp[3] += dy[i * dy_stride + j] * dy[i * dy_stride + j];
    }
  }

  // Apply regularization
  // We follow the standard regularization method of adding `k * I` before
  // inverting. This ensures that the matrix will be invertible.
  //
  // Setting the regularization strength k to 1 seems to work well here, as
  // typical values coming from the other equations are very large (1e5 to
  // 1e6, with an upper limit of around 6e7, at the time of writing).
  // It also preserves the property that all matrix values are whole numbers,
  // which is convenient for integerized SIMD implementation.
  tmp[0] += 1;
  tmp[3] += 1;

  tmp[2] = tmp[1];

  M[0] = (double)tmp[0];
  M[1] = (double)tmp[1];
  M[2] = (double)tmp[2];
  M[3] = (double)tmp[3];
}